

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellLinkAndJumpListHandler.cpp
# Opt level: O3

void __thiscall
ShellLinkAndJumpListHandler::parseLNKStruct
          (ShellLinkAndJumpListHandler *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *headerValue)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  long *plVar7;
  uint uVar8;
  undefined1 local_58 [8];
  undefined8 uStack_50;
  pointer local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  ReadStream::read((ReadStream *)local_58,(int)this->rs,(void *)(ulong)(this->startPosition + 4),4);
  puVar1 = (headerValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (headerValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (headerValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_58;
  (headerValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = uStack_50;
  (headerValue->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = local_48;
  local_58._0_4_ = 0;
  local_58[4] = false;
  local_58._5_3_ = 0;
  uStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1,(long)puVar2 - (long)puVar1);
    if ((ShellLink)local_58 != (ShellLink)0x0) {
      operator_delete((void *)local_58,(long)local_48 - (long)local_58);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_38,headerValue);
  iVar4 = Utils::lenFourBytesChar(&local_38);
  if (local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (iVar4 == 0x1140200) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"[ShellLink structure ",0x15);
    *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) =
         *(uint *)(std::istream::seekg + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 2;
    poVar6 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,this->countOfShellLink + 1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]: ",3);
    local_58._0_4_ = 0;
    local_58[4] = false;
    local_58._5_3_ = 0;
    ShellLink::parseShellLinkStructure((ShellLink *)local_58,this->rs,this->startPosition);
    uVar5 = ShellLink::getShellLinkOffsetEnd((ShellLink *)local_58);
    uVar8 = uVar5 + 0xf;
    if (-1 < (int)uVar5) {
      uVar8 = uVar5;
    }
    iVar4 = (uVar8 & 0xfffffff0) + 0xc;
    if (uVar5 == (uVar8 & 0xfffffff0)) {
      iVar4 = uVar5 - 4;
    }
    this->startPosition = iVar4;
    this->countOfShellLink = this->countOfShellLink + 1;
    bVar3 = ShellLink::isThisShellLinkHasErrors((ShellLink *)local_58);
    if (bVar3) {
      this->countOfShellLinkWithErrors = this->countOfShellLinkWithErrors + 1;
    }
    ShellLink::resetAllFlags((ShellLink *)local_58);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    plVar7 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    plVar7 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar7 + -0x18) + (char)plVar7);
    std::ostream::put((char)plVar7);
    std::ostream::flush();
  }
  else {
    this->startPosition = this->startPosition + 4;
  }
  return;
}

Assistant:

void ShellLinkAndJumpListHandler::parseLNKStruct(std::vector<unsigned char> headerValue) {
    /* Decode ShellLink Stream = CustDest Jump List */
    headerValue =  rs->read(startPosition + 4,4);
    if (Utils::lenFourBytesChar(headerValue) != 0x01140200) { // Если следующее поле не CLSID -> ищем структуры далее
        startPosition += 4;
        return;
    }
    cout << "[ShellLink structure " << dec << countOfShellLink + 1 << "]: ";
    ShellLink shellLink = ShellLink();
    shellLink.parseShellLinkStructure(rs, startPosition);
    int offsetEnd = shellLink.getShellLinkOffsetEnd();
    int remainder = offsetEnd % 16;
    startPosition = remainder == 0 ? offsetEnd - 4 : offsetEnd + 12 - remainder;  // так как в while будет + 4
    ++countOfShellLink;
    if(shellLink.isThisShellLinkHasErrors())
        ++countOfShellLinkWithErrors;
    shellLink.resetAllFlags();
    cout << endl << endl << endl;
    return;
}